

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void Excel::Parser::loadSheet
               (size_t sheetIdx,BoundSheet *boundSheet,Stream *stream,IStorage *storage)

{
  Stream *this;
  stringstream *this_00;
  short sVar1;
  Exception *pEVar2;
  IStorage *__nbytes;
  void *__buf;
  void *__buf_00;
  double dVar3;
  double dVar4;
  int16_t row;
  int16_t column;
  int16_t xfIndex;
  int16_t version;
  Record record;
  short local_20e;
  short local_20c [2];
  wstring local_208;
  undefined1 local_1e8 [416];
  pointer local_48;
  pointer piStack_40;
  pointer local_38;
  
  __nbytes = storage;
  (*stream->_vptr_Stream[4])(stream,(ulong)(uint)boundSheet->m_BOFPosition,0);
  local_1e8._0_8_ = ((ulong)local_1e8._0_8_ >> 0x10 & 0xffff) << 0x10;
  local_1e8._16_4_ = stream->m_byteOrder;
  local_1e8._8_8_ = &PTR__RecordSubstream_0010fcc8;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 0x18));
  local_48 = (pointer)0x0;
  piStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  Record::read((Record *)local_1e8,(int)stream,__buf,(size_t)__nbytes);
  local_208._M_dataplus._M_p = local_208._M_dataplus._M_p & 0xffffffffffff0000;
  local_20e = 0;
  Stream::read<short>((Stream *)(local_1e8 + 8),(short *)&local_208,2);
  Stream::read<short>((Stream *)(local_1e8 + 8),&local_20e,2);
  sVar1 = (short)local_208._M_dataplus._M_p;
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  local_1e8._8_8_ = &PTR__RecordSubstream_0010fcc8;
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 0x18));
  std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x98));
  if (sVar1 != 0x600) {
    pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>
              ((wstring *)local_1e8,L"Unsupported BIFF version. BIFF8 is supported only.",L"");
    Exception::Exception(pEVar2,(wstring *)local_1e8);
    __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
  }
  this = (Stream *)(local_1e8 + 8);
  this_00 = (stringstream *)(local_1e8 + 0x18);
  do {
    local_1e8._0_8_ = ((ulong)local_1e8._0_8_ >> 0x10 & 0xffff) << 0x10;
    local_1e8._16_4_ = stream->m_byteOrder;
    local_1e8._8_8_ = &PTR__RecordSubstream_0010fcc8;
    std::__cxx11::stringstream::stringstream(this_00);
    local_48 = (pointer)0x0;
    piStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    Record::read((Record *)local_1e8,(int)stream,__buf_00,(size_t)__nbytes);
    if ((ushort)local_1e8._0_2_ < 0xfd) {
      if ((ushort)local_1e8._0_2_ < 0x7e) {
        if (local_1e8._0_2_ == 6) {
          __nbytes = storage;
          handleFORMULA((Record *)local_1e8,stream,sheetIdx,storage);
        }
        else if (local_1e8._0_2_ == 10) {
          if (local_48 != (pointer)0x0) {
            operator_delete(local_48,(long)local_38 - (long)local_48);
          }
          local_1e8._8_8_ = &PTR__RecordSubstream_0010fcc8;
          std::__cxx11::stringstream::~stringstream(this_00);
          std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x98));
          return;
        }
      }
      else if (local_1e8._0_2_ == 0x7e) {
LAB_00109424:
        local_20e = 0;
        local_20c[0] = 0;
        local_208._M_dataplus._M_p = (pointer)((ulong)local_208._M_dataplus._M_p._4_4_ << 0x20);
        Stream::read<short>(this,&local_20e,2);
        Stream::read<short>(this,local_20c,2);
        (**(_func_int **)(local_1e8._8_8_ + 0x20))(this,2,1);
        Stream::read<unsigned_int>(this,(uint *)&local_208,4);
        if (((ulong)local_208._M_dataplus._M_p & 2) == 0) {
          dVar3 = (double)((ulong)((uint)local_208._M_dataplus._M_p & 0xfffffffc) << 0x20);
        }
        else {
          dVar3 = (double)((uint)local_208._M_dataplus._M_p >> 2);
        }
        dVar4 = dVar3;
        if (((ulong)local_208._M_dataplus._M_p & 1) != 0) {
          dVar4 = dVar3 / 100.0;
        }
        __nbytes = (IStorage *)(long)local_20c[0];
        (*storage->_vptr_IStorage[7])(dVar4,dVar3 / 100.0,storage,sheetIdx,(long)local_20e);
      }
      else if (local_1e8._0_2_ == 0xbd) {
        handleMULRK((Record *)local_1e8,sheetIdx,storage);
      }
    }
    else if ((ushort)local_1e8._0_2_ < 0x204) {
      if (local_1e8._0_2_ == 0xfd) {
        local_20e = 0;
        local_20c[0] = 0;
        local_20c[1] = 0;
        local_208._M_dataplus._M_p = (pointer)((ulong)local_208._M_dataplus._M_p._4_4_ << 0x20);
        Stream::read<short>(this,&local_20e,2);
        Stream::read<short>(this,local_20c,2);
        Stream::read<short>(this,local_20c + 1,2);
        Stream::read<int>(this,(int *)&local_208,4);
        __nbytes = (IStorage *)(long)local_20c[0];
        (*storage->_vptr_IStorage[5])
                  (storage,sheetIdx,(long)local_20e,__nbytes,
                   (long)(int)(uint)local_208._M_dataplus._M_p);
      }
      else if (local_1e8._0_2_ == 0x203) {
        local_20e = 0;
        local_20c[0] = 0;
        Stream::read<short>(this,&local_20e,2);
        Stream::read<short>(this,local_20c,2);
        (**(_func_int **)(local_1e8._8_8_ + 0x20))(this,2,1);
        Stream::read<unsigned_long>(this,(unsigned_long *)&local_208,8);
        __nbytes = (IStorage *)(long)local_20c[0];
        (*storage->_vptr_IStorage[7])(local_208._M_dataplus._M_p,storage,sheetIdx,(long)local_20e);
      }
    }
    else if (local_1e8._0_2_ == 0x204) {
      handleLabel((Record *)local_1e8,sheetIdx,storage);
    }
    else {
      if (local_1e8._0_2_ == 0x27e) goto LAB_00109424;
      if (local_1e8._0_2_ == 0xffff) {
        pEVar2 = (Exception *)__cxa_allocate_exception(0x30);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)&local_208,L"Wrong format.",L"");
        Exception::Exception(pEVar2,&local_208);
        __cxa_throw(pEVar2,&Exception::typeinfo,Exception::~Exception);
      }
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
    local_1e8._8_8_ = &PTR__RecordSubstream_0010fcc8;
    std::__cxx11::stringstream::~stringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x98));
  } while( true );
}

Assistant:

inline void
Parser::loadSheet( size_t sheetIdx, const BoundSheet & boundSheet,
	Stream & stream, IStorage & storage )
{
	stream.seek( boundSheet.BOFPosition(), Stream::FromBeginning );
	BOF bof;

	{
		Record record( stream );

		bof.parse( record );
	}

	if( bof.version() != BOF::BIFF8 )
		throw Exception( L"Unsupported BIFF version. BIFF8 is supported only." );

	while( true )
	{
		Record record( stream );

		switch( record.code() )
		{
			case XL_LABELSST :
				handleLabelSST( record, sheetIdx, storage );
				break;

			case XL_LABEL :
				handleLabel( record, sheetIdx, storage );
				break;

			case XL_RK :
			case XL_RK2 :
				handleRK( record, sheetIdx, storage );
				break;

			case XL_MULRK :
				handleMULRK( record, sheetIdx, storage );
				break;

			case XL_NUMBER :
				handleNUMBER( record, sheetIdx, storage );
				break;

			case XL_FORMULA :
				handleFORMULA( record, stream, sheetIdx, storage );
				break;

			case XL_EOF :
				return;

			case XL_UNKNOWN :
				throw Exception( L"Wrong format." );

			default:
				break;
		}
	}
}